

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.cc
# Opt level: O2

int __thiscall
flow::BrInstr::clone(BrInstr *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  BasicBlock *local_18;
  
  std::make_unique<flow::BrInstr,flow::BasicBlock*>(&local_18);
  (this->super_TerminateInstr).super_Instr.super_Value._vptr_Value = (_func_int **)local_18;
  return (int)this;
}

Assistant:

std::unique_ptr<Instr> BrInstr::clone() {
  return std::make_unique<BrInstr>(targetBlock());
}